

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>
          (DelayedEofInputStream *this,unsigned_long requested,Promise<unsigned_long> *innerPromise)

{
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  SourceLocation location;
  AsyncInputStream AVar3;
  void *pvVar4;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *in_RCX;
  TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6839:32),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6854:10)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  anon_class_8_1_8991fb9c_for_errorHandler local_78;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  code *local_68;
  anon_class_16_2_8ec82bdb_for_func local_60;
  AsyncInputStream local_50;
  char *local_48;
  undefined *puStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  puStack_40 = &DAT_0042eb79;
  local_38 = 0xe00001ab7;
  local_68 = kj::_::
             TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6839:32),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6854:10)>
             ::anon_class_16_2_8ec82bdb_for_func::operator();
  pPVar1 = in_RCX->ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  local_78.this = (DelayedEofInputStream *)requested;
  local_60.this = (DelayedEofInputStream *)requested;
  local_60.requested = (unsigned_long)innerPromise;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x38) {
    pvVar4 = operator_new(0x400);
    location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6839:32),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6854:10)>
                   *)((long)pvVar4 + 0x3c8);
    ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(kj::Exception&&)_1_,void*&>
              (location_00,in_RCX,&local_60,&local_78,&local_68);
    *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6839:32),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6854:10)>
                   *)&pPVar1[-4].super_PromiseArenaMember.arena;
    ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(kj::Exception&&)_1_,void*&>
              (location_00,in_RCX,&local_60,&local_78,&local_68);
    pPVar1[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  location.function = puStack_40;
  location.fileName = local_48;
  location.lineNumber = (undefined4)local_38;
  location.columnNumber = local_38._4_4_;
  local_70.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<unsigned_long>
            ((OwnPromiseNode *)&local_50,(Promise<unsigned_long> *)&local_70,location);
  AVar3._vptr_AsyncInputStream = local_50._vptr_AsyncInputStream;
  local_50._vptr_AsyncInputStream = (_func_int **)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50);
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = AVar3._vptr_AsyncInputStream;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<T> wrap(T requested, kj::Promise<T> innerPromise) {
      return innerPromise.then([this,requested](T actual) -> kj::Promise<T> {
        if (actual < requested) {
          // Must have reached EOF.
          KJ_IF_SOME(t, completionTask) {
            // Delay until completion.
            auto result = t.then([actual]() { return actual; });
            completionTask = kj::none;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return actual;
          }
        } else {
          return actual;
        }
      }, [this](kj::Exception&& e) -> kj::Promise<T> {
        // The stream threw an exception, but this exception is almost certainly just complaining
        // that the other end of the stream was dropped. In all likelihood, the HttpService
        // request() call itself will throw a much more interesting error -- we'd rather propagate
        // that one, if so.
        KJ_IF_SOME(t, completionTask) {
          auto result = t.then([e = kj::mv(e)]() mutable -> kj::Promise<T> {
            // Looks like the service didn't throw. I guess we should propagate the stream error
            // after all.
            return kj::mv(e);
          });
          completionTask = kj::none;
          return result;
        } else {
          // Must have called tryRead() again after we already signaled EOF or threw. Fine.
          return kj::mv(e);
        }
      });
    }